

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

uchar * runfind(uchar *lst,runsdef *item)

{
  void *__s2;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uchar *in_RSI;
  void *in_RDI;
  uint curlen;
  uint len;
  void *in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  int local_1c;
  uchar *local_10;
  
  local_1c = osrp2(in_RDI);
  local_1c = local_1c + -2;
  local_10 = (uchar *)((long)in_RDI + 2);
  do {
    if (local_1c == 0) {
      return (uchar *)0x0;
    }
    if (*local_10 == *in_RSI) {
      switch(*local_10) {
      case '\x01':
        lVar5 = osrp4s(local_10 + 1);
        if (lVar5 == *(long *)(in_RSI + 8)) {
          return local_10;
        }
        break;
      case '\x02':
      case '\n':
        uVar3 = osrp2(local_10 + 1);
        if (uVar3 == *(ushort *)(in_RSI + 8)) {
          return local_10;
        }
        break;
      case '\x03':
      case '\a':
        iVar1 = osrp2(local_10 + 1);
        iVar2 = osrp2(*(void **)(in_RSI + 8));
        if (iVar1 == iVar2) {
          in_stack_ffffffffffffffc0 = local_10 + 1;
          __s2 = *(void **)(in_RSI + 8);
          iVar1 = osrp2(local_10 + 1);
          iVar1 = memcmp(in_stack_ffffffffffffffc0,__s2,(long)iVar1);
          if (iVar1 == 0) {
            return local_10;
          }
        }
        break;
      case '\x05':
      case '\b':
        return local_10;
      case '\r':
        uVar3 = osrp2(local_10 + 1);
        if (uVar3 == *(ushort *)(in_RSI + 8)) {
          return local_10;
        }
      }
    }
    uVar4 = datsiz((dattyp)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_10 = local_10 + (uVar4 + 1);
    local_1c = local_1c - (uVar4 + 1);
  } while( true );
}

Assistant:

uchar *runfind(uchar *lst, runsdef *item)
{
    uint len;
    uint curlen;
    
    for (len = osrp2(lst) - 2, lst += 2 ; len ; lst += curlen, len -= curlen)
    {
        if (*lst == item->runstyp)
        {
            switch(*lst)
            {
            case DAT_LIST:
            case DAT_SSTRING:
                if (osrp2(lst+1) == osrp2(item->runsv.runsvstr) &&
                   !memcmp(lst+1, item->runsv.runsvstr, (size_t)osrp2(lst+1)))
                    return(lst);
                break;
            case DAT_NUMBER:
                if (osrp4s(lst+1) == item->runsv.runsvnum)
                    return(lst);
                break;

            case DAT_TRUE:
            case DAT_NIL:
                return(lst);

            case DAT_OBJECT:
            case DAT_FNADDR:
                if (osrp2(lst+1) == item->runsv.runsvobj)
                    return(lst);
                break;

            case DAT_PROPNUM:
                if (osrp2(lst+1) == item->runsv.runsvprp)
                    return(lst);
                break;
            }
        }
        curlen = datsiz(*lst, lst+1) + 1;
    }
    return((uchar *)0);
}